

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeWriter.cpp
# Opt level: O3

bool __thiscall
Js::ByteCodeWriter::TryWriteBrReg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>>
          (ByteCodeWriter *this,OpCode op,ByteCodeLabel labelID,RegSlot R1,RegSlot R2)

{
  bool bVar1;
  undefined1 local_34 [8];
  OpLayoutT_BrReg2<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> layout;
  
  if ((((DAT_0159efbd == '\0') && (DAT_0159efbc == '\0')) && (R1 < 0x100)) && (R2 < 0x100)) {
    Data::EncodeT<(Js::LayoutSize)0>(&this->m_byteCodeData,op,this);
    Data::Write(&this->m_byteCodeData,local_34,4);
    AddJumpOffset(this,op,labelID,4);
    bVar1 = true;
  }
  else {
    bVar1 = false;
  }
  return bVar1;
}

Assistant:

bool ByteCodeWriter::TryWriteBrReg2(OpCode op, ByteCodeLabel labelID, RegSlot R1, RegSlot R2)
    {
        OpLayoutT_BrReg2<SizePolicy> layout;
        if (SizePolicy::Assign(layout.R1, R1) && SizePolicy::Assign(layout.R2, R2))
        {
            size_t const offsetOfRelativeJumpOffsetFromEnd = sizeof(OpLayoutT_BrReg2<SizePolicy>) - offsetof(OpLayoutT_BrReg2<SizePolicy>, RelativeJumpOffset);
            layout.RelativeJumpOffset = offsetOfRelativeJumpOffsetFromEnd;
            m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
            AddJumpOffset(op, labelID, offsetOfRelativeJumpOffsetFromEnd);
            return true;
        }
        return false;
    }